

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShaderGenerator.cpp
# Opt level: O0

char * rsg::anon_unknown_27::getFragColorName(GeneratorState *state)

{
  ProgramParameters *pPVar1;
  GeneratorState *state_local;
  
  pPVar1 = GeneratorState::getProgramParameters(state);
  if (pPVar1->version == VERSION_100) {
    state_local = (GeneratorState *)anon_var_dwarf_972082;
  }
  else if (pPVar1->version == VERSION_300) {
    state_local = (GeneratorState *)anon_var_dwarf_972077;
  }
  else {
    state_local = (GeneratorState *)0x0;
  }
  return (char *)state_local;
}

Assistant:

const char* getFragColorName (const GeneratorState& state)
{
	switch (state.getProgramParameters().version)
	{
		case VERSION_100:	return "gl_FragColor";
		case VERSION_300:	return "dEQP_FragColor";
		default:
			DE_ASSERT(DE_FALSE);
			return DE_NULL;
	}
}